

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PDynArray * NewDynArray(PType *type)

{
  size_t in_RAX;
  PDynArray *this;
  size_t bucket;
  size_t local_18;
  
  local_18 = in_RAX;
  this = (PDynArray *)
         FTypeTable::FindType
                   (&TypeTable,PDynArray::RegistrationInfo.MyClass,(intptr_t)type,0,&local_18);
  if (this == (PDynArray *)0x0) {
    this = (PDynArray *)DObject::operator_new(0x88);
    PDynArray::PDynArray(this,type);
    FTypeTable::AddType(&TypeTable,(PType *)this,PDynArray::RegistrationInfo.MyClass,(intptr_t)type,
                        0,local_18);
  }
  return this;
}

Assistant:

PDynArray *NewDynArray(PType *type)
{
	size_t bucket;
	PType *atype = TypeTable.FindType(RUNTIME_CLASS(PDynArray), (intptr_t)type, 0, &bucket);
	if (atype == NULL)
	{
		atype = new PDynArray(type);
		TypeTable.AddType(atype, RUNTIME_CLASS(PDynArray), (intptr_t)type, 0, bucket);
	}
	return (PDynArray *)atype;
}